

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O1

void __thiscall
Assimp::OptimizeMeshesProcess::ProcessNode(OptimizeMeshesProcess *this,aiNode *pNode)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  pointer *pppaVar1;
  uint *puVar2;
  pointer pMVar3;
  bool bVar4;
  aiMesh *paVar5;
  ulong uVar6;
  aiMesh **__args;
  aiMesh **ppaVar7;
  iterator iVar8;
  uint uVar9;
  uint verts;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  aiMesh *out;
  aiMesh *local_38;
  
  if (pNode->mNumMeshes != 0) {
    this_00 = &this->merge_list;
    uVar12 = 0;
    do {
      puVar2 = pNode->mMeshes;
      pMVar3 = (this->meshes).
               super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar3[puVar2[uVar12]].instance_cnt < 2) {
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(this_00,0);
        uVar11 = uVar12 + 1;
        if (uVar11 < pNode->mNumMeshes) {
          uVar9 = 0;
          uVar6 = uVar12 & 0xffffffff;
          verts = 0;
          do {
            uVar10 = pNode->mMeshes[uVar11 & 0xffffffff];
            if ((this->meshes).
                super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10].instance_cnt == 1) {
              bVar4 = CanJoin(this,puVar2[uVar12],uVar10,verts,uVar9);
              if (bVar4) {
                ppaVar7 = this->mScene->mMeshes + uVar10;
                iVar8._M_current =
                     (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar8,ppaVar7);
                }
                else {
                  *iVar8._M_current = *ppaVar7;
                  pppaVar1 = &(this->merge_list).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar1 = *pppaVar1 + 1;
                }
                paVar5 = this->mScene->mMeshes[uVar10];
                verts = verts + paVar5->mNumVertices;
                uVar9 = uVar9 + paVar5->mNumFaces;
                pNode->mMeshes[uVar11 & 0xffffffff] = pNode->mMeshes[pNode->mNumMeshes - 1];
                pNode->mNumMeshes = pNode->mNumMeshes - 1;
              }
              else {
                uVar6 = uVar11 & 0xffffffff;
              }
            }
            else {
              uVar6 = uVar11 & 0xffffffff;
            }
            uVar10 = (int)uVar6 + 1;
            uVar11 = (ulong)uVar10;
          } while (uVar10 < pNode->mNumMeshes);
        }
        iVar8._M_current =
             (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if ((this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start == iVar8._M_current) {
          ppaVar7 = this->mScene->mMeshes + puVar2[uVar12];
          iVar8._M_current =
               (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            paVar5 = *ppaVar7;
            goto LAB_003d00c4;
          }
LAB_003d00dd:
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->output,iVar8,ppaVar7);
        }
        else {
          __args = this->mScene->mMeshes + puVar2[uVar12];
          ppaVar7 = &local_38;
          if (iVar8._M_current ==
              (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar8,__args);
          }
          else {
            *iVar8._M_current = *__args;
            pppaVar1 = &(this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppaVar1 = *pppaVar1 + 1;
          }
          SceneCombiner::MergeMeshes
                    (ppaVar7,0,
                     (const_iterator)
                     (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (const_iterator)
                     (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          iVar8._M_current =
               (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          paVar5 = local_38;
          if (iVar8._M_current ==
              (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_003d00dd;
LAB_003d00c4:
          *iVar8._M_current = paVar5;
          pppaVar1 = &(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppaVar1 = *pppaVar1 + 1;
        }
        uVar9 = (int)((ulong)((long)(this->output).
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->output).
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) - 1;
      }
      else {
        uVar9 = pMVar3[puVar2[uVar12]].output_id;
      }
      puVar2[uVar12] = uVar9;
      uVar12 = uVar12 + 1;
    } while (uVar12 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar12 = 0;
    do {
      ProcessNode(this,pNode->mChildren[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::ProcessNode( aiNode* pNode)
{
    for (unsigned int i = 0; i < pNode->mNumMeshes;++i) {
        unsigned int& im = pNode->mMeshes[i];

        if (meshes[im].instance_cnt > 1) {
            im = meshes[im].output_id;
        }
        else  {
            merge_list.resize( 0 );
            unsigned int verts = 0, faces = 0;

            // Find meshes to merge with us
            for (unsigned int a = i+1; a < pNode->mNumMeshes;++a) {
                unsigned int am = pNode->mMeshes[a];
                if (meshes[am].instance_cnt == 1 && CanJoin(im,am,verts,faces)) {

                    merge_list.push_back(mScene->mMeshes[am]);
                    verts += mScene->mMeshes[am]->mNumVertices;
                    faces += mScene->mMeshes[am]->mNumFaces;

                    pNode->mMeshes[a] = pNode->mMeshes[pNode->mNumMeshes - 1];
                    --pNode->mNumMeshes;
                    --a;
                }
            }

            // and merge all meshes which we found, replace the old ones
            if (!merge_list.empty()) {
                merge_list.push_back(mScene->mMeshes[im]);

                aiMesh* out;
                SceneCombiner::MergeMeshes(&out,0,merge_list.begin(),merge_list.end());
                output.push_back(out);
            } else {
                output.push_back(mScene->mMeshes[im]);
            }
            im = static_cast<unsigned int>(output.size()-1);
        }
    }


    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        ProcessNode( pNode->mChildren[ i ] );
    }
}